

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadSideDefs2(MapData *map,FMissingTextureTracker *missingtex)

{
  FileReader *pFVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  short *psVar6;
  long lVar7;
  side_t *psVar8;
  sector_t_conflict *sec;
  double dVar9;
  intmapsidedef_t imsd;
  
  pFVar1 = map->MapLumps[3].Reader;
  if (pFVar1 == (FileReader *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(uint)pFVar1->Length;
  }
  pvVar3 = operator_new__(uVar4);
  lVar5 = pFVar1->Length;
  map->file = pFVar1;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pvVar3,(long)(int)lVar5);
  if (0 < numsides) {
    lVar7 = 4;
    lVar5 = 0;
    uVar4 = 0;
    do {
      psVar8 = sides;
      psVar6 = (short *)((ulong)*(uint *)((long)&sidetemp->field_0 + lVar7 + 4) * 0x1e +
                        (long)pvVar3);
      if (gameinfo.gametype == GAME_Strife) {
        iVar2 = strncmp((char *)(psVar6 + 10),"LASERB01",8);
        if (iVar2 == 0) {
          psVar6[1] = psVar6[1] + 0x66;
        }
      }
      dVar9 = (double)(int)*psVar6;
      *(double *)((long)&psVar8->textures[2].xOffset + lVar5) = dVar9;
      *(double *)((long)&psVar8->textures[1].xOffset + lVar5) = dVar9;
      *(double *)((long)&psVar8->textures[0].xOffset + lVar5) = dVar9;
      dVar9 = (double)(int)psVar6[1];
      *(double *)((long)&psVar8->textures[2].yOffset + lVar5) = dVar9;
      *(double *)((long)&psVar8->textures[1].yOffset + lVar5) = dVar9;
      *(double *)((long)&psVar8->textures[0].yOffset + lVar5) = dVar9;
      *(undefined8 *)((long)&psVar8->textures[2].xScale + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)&psVar8->textures[1].xScale + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)&psVar8->textures[0].xScale + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)&psVar8->textures[2].yScale + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)&psVar8->textures[1].yScale + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)&psVar8->textures[0].yScale + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)&psVar8->linedef + lVar5) = 0;
      (&psVar8->Flags)[lVar5] = '\0';
      *(int *)((long)&psVar8->Index + lVar5) = (int)uVar4;
      if ((uint)(int)psVar6[0xe] < (uint)numsectors) {
        sec = sectors + (int)psVar6[0xe];
      }
      else {
        Printf(2,"Sidedef %d has a bad sector\n",uVar4 & 0xffffffff);
        sec = (sector_t_conflict *)0x0;
      }
      psVar8 = (side_t *)((long)psVar8->textures + lVar5 + -0x10);
      psVar8->sector = sec;
      imsd.toptexture.Chars = FString::NullString.Nothing;
      imsd.bottomtexture.Chars = FString::NullString.Nothing;
      imsd.midtexture.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 3;
      FString::CopyCStrPart(&imsd.toptexture,(char *)(psVar6 + 2),8);
      FString::CopyCStrPart(&imsd.midtexture,(char *)(psVar6 + 10),8);
      FString::CopyCStrPart(&imsd.bottomtexture,(char *)(psVar6 + 6),8);
      P_ProcessSideTextures
                ((bool)(map->HasBehavior ^ 1),psVar8,sec,&imsd,
                 (int)*(short *)((long)sidetemp + lVar7 + -2),
                 (int)*(short *)((long)sidetemp + lVar7 + -4),
                 (short *)((long)&sidetemp->field_0 + lVar7),missingtex);
      FString::~FString(&imsd.midtexture);
      FString::~FString(&imsd.bottomtexture);
      FString::~FString(&imsd.toptexture);
      uVar4 = uVar4 + 1;
      lVar7 = lVar7 + 0xc;
      lVar5 = lVar5 + 0xc0;
    } while ((long)uVar4 < (long)numsides);
  }
  operator_delete__(pvVar3);
  return;
}

Assistant:

void P_LoadSideDefs2 (MapData *map, FMissingTextureTracker &missingtex)
{
	int  i;
	char * msdf = new char[map->Size(ML_SIDEDEFS)];
	map->Read(ML_SIDEDEFS, msdf);

	for (i = 0; i < numsides; i++)
	{
		mapsidedef_t *msd = ((mapsidedef_t*)msdf) + sidetemp[i].a.map;
		side_t *sd = sides + i;
		sector_t *sec;

		// [RH] The Doom renderer ignored the patch y locations when
		// drawing mid textures. ZDoom does not, so fix the laser beams in Strife.
		if (gameinfo.gametype == GAME_Strife &&
			strncmp (msd->midtexture, "LASERB01", 8) == 0)
		{
			msd->rowoffset += 102;
		}

		sd->SetTextureXOffset(LittleShort(msd->textureoffset));
		sd->SetTextureYOffset(LittleShort(msd->rowoffset));
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->linedef = NULL;
		sd->Flags = 0;
		sd->Index = i;

		// killough 4/4/98: allow sidedef texture names to be overloaded
		// killough 4/11/98: refined to allow colormaps to work as wall
		// textures if invalid as colormaps but valid as textures.

		if ((unsigned)LittleShort(msd->sector)>=(unsigned)numsectors)
		{
			Printf (PRINT_HIGH, "Sidedef %d has a bad sector\n", i);
			sd->sector = sec = NULL;
		}
		else
		{
			sd->sector = sec = &sectors[LittleShort(msd->sector)];
		}

		intmapsidedef_t imsd;
		imsd.toptexture.CopyCStrPart(msd->toptexture, 8);
		imsd.midtexture.CopyCStrPart(msd->midtexture, 8);
		imsd.bottomtexture.CopyCStrPart(msd->bottomtexture, 8);

		P_ProcessSideTextures(!map->HasBehavior, sd, sec, &imsd, 
							  sidetemp[i].a.special, sidetemp[i].a.tag, &sidetemp[i].a.alpha, missingtex);
	}
	delete[] msdf;
}